

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O2

void av1_ml_prune_4_partition
               (AV1_COMP *cpi,MACROBLOCK *x,int part_ctx,int64_t best_rd,
               PartitionSearchState *part_state,int *part4_allowed,uint pb_source_variance)

{
  ExtPartController *ext_part_controller;
  byte bVar1;
  byte bVar2;
  long lVar3;
  uint8_t *puVar4;
  BLOCK_SIZE BVar5;
  BLOCK_SIZE BVar6;
  _Bool _Var7;
  BLOCK_SIZE BVar8;
  int i;
  uint uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  int64_t iVar13;
  NN_CONFIG *pNVar14;
  ulong uVar15;
  uint mi_col;
  int iVar16;
  uint8_t *puVar17;
  int iVar18;
  float fVar19;
  float fVar20;
  int in_stack_ffffffffffffd3b8;
  uint vert_4_source_var [4];
  uint horz_4_source_var [4];
  int int_score [4];
  float score [4];
  int sub_block_rdcost [8];
  float afStack_297c [8];
  float afStack_295c [4];
  float afStack_294c [565];
  float features [18];
  int local_3c;
  int iStack_38;
  
  iVar11 = (part_state->part_blk_params).mi_row;
  iVar16 = (part_state->part_blk_params).mi_col;
  BVar8 = (part_state->part_blk_params).bsize;
  mi_col = (uint)BVar8;
  if ((((cpi->common).current_frame.frame_type & 0xfd) == 0) ||
     (ext_part_controller = &cpi->ext_part_controller, ext_part_controller->ready == 0)) {
    _Var7 = false;
  }
  else {
    sub_block_rdcost[0] = 7;
    iVar10 = 0x1f;
    if (pb_source_variance != 0) {
      for (; pb_source_variance >> iVar10 == 0; iVar10 = iVar10 + -1) {
      }
    }
    features[4] = 0.0;
    features[5] = 0.0;
    features[6] = 0.0;
    features[7] = 0.0;
    features[0] = 0.0;
    features[1] = 0.0;
    features[2] = 0.0;
    features[3] = 0.0;
    for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
      lVar3 = part_state->rect_part_rd[0][lVar12];
      if (lVar3 - 1U < 999999999) {
        features[lVar12] = (float)lVar3;
      }
    }
    for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
      lVar3 = part_state->rect_part_rd[1][lVar12];
      if (lVar3 - 1U < 999999999) {
        features[lVar12 + 2] = (float)lVar3;
      }
    }
    for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
      if (part_state->split_rd[lVar12] - 1U < 999999999) {
        features[lVar12 + 4] = (float)part_state->split_rd[lVar12];
      }
    }
    iVar13 = 0x7fffffff;
    if (best_rd < 0x7fffffff) {
      iVar13 = best_rd;
    }
    for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 1) {
      fVar20 = features[lVar12];
      if ((int)fVar20 < (int)iVar13) {
        fVar19 = (float)(int)fVar20 / (float)(int)iVar13;
      }
      else {
        fVar19 = 1.0;
      }
      if ((int)fVar20 < 1) {
        fVar19 = 1.0;
      }
      afStack_297c[lVar12] = fVar19;
    }
    horz_4_source_var[0] = 0;
    horz_4_source_var[1] = 0;
    horz_4_source_var[2] = 0;
    horz_4_source_var[3] = 0;
    vert_4_source_var[0] = 0;
    vert_4_source_var[1] = 0;
    vert_4_source_var[2] = 0;
    vert_4_source_var[3] = 0;
    BVar5 = get_partition_subsize(BVar8,'\b');
    BVar6 = get_partition_subsize(BVar8,'\t');
    mi_col = (uint)BVar8;
    av1_setup_src_planes
              (x,cpi->source,iVar11,iVar16,
               (uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1,BVar8);
    iVar10 = x->plane[0].src.stride;
    puVar4 = x->plane[0].src.buf;
    bVar1 = block_size_high[BVar5];
    bVar2 = block_size_wide[BVar6];
    iVar18 = 0;
    puVar17 = puVar4;
    for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
      score._0_8_ = puVar4 + iVar18;
      int_score._0_8_ = puVar17;
      uVar9 = av1_get_perpixel_variance_facade(cpi,&x->e_mbd,(buf_2d *)score,BVar5,0);
      horz_4_source_var[lVar12] = uVar9;
      uVar9 = av1_get_perpixel_variance_facade(cpi,&x->e_mbd,(buf_2d *)int_score,BVar6,0);
      vert_4_source_var[lVar12] = uVar9;
      puVar17 = puVar17 + bVar2;
      iVar18 = iVar18 + (uint)bVar1 * iVar10;
    }
    for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
      fVar19 = (float)(horz_4_source_var[lVar12] + 1) / (float)(pb_source_variance + 1);
      fVar20 = 0.1;
      if (0.1 <= fVar19) {
        fVar20 = fVar19;
      }
      fVar19 = 10.0;
      if (fVar20 <= 10.0) {
        fVar19 = fVar20;
      }
      afStack_295c[lVar12] = fVar19;
    }
    for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
      fVar19 = (float)(vert_4_source_var[lVar12] + 1) / (float)(pb_source_variance + 1);
      fVar20 = 0.1;
      if (0.1 <= fVar19) {
        fVar20 = fVar19;
      }
      fVar19 = 10.0;
      if (fVar20 <= 10.0) {
        fVar19 = fVar20;
      }
      afStack_294c[lVar12] = fVar19;
    }
    av1_ext_part_send_features(ext_part_controller,(aom_partition_features_t *)sub_block_rdcost);
    _Var7 = av1_ext_part_get_partition_decision
                      (ext_part_controller,(aom_partition_decision_t *)features);
    if (_Var7) {
      part4_allowed[0] = local_3c;
      part4_allowed[1] = iStack_38;
    }
  }
  if (best_rd < 1000000000 && _Var7 == false) {
    if (mi_col == 6) {
      pNVar14 = &av1_4_partition_nnconfig_16;
    }
    else if (mi_col == 0xc) {
      pNVar14 = &av1_4_partition_nnconfig_64;
    }
    else {
      if (mi_col != 9) {
        return;
      }
      pNVar14 = &av1_4_partition_nnconfig_32;
    }
    uVar9 = 0x1f;
    if (pb_source_variance != 0) {
      for (; pb_source_variance >> uVar9 == 0; uVar9 = uVar9 - 1) {
      }
    }
    iVar10 = (uVar9 ^ 0xffffffe0) + 0x21;
    if (pb_source_variance == 0) {
      iVar10 = 0;
    }
    features[1] = (float)iVar10;
    features[0] = (float)part_ctx;
    sub_block_rdcost[4] = 0;
    sub_block_rdcost[5] = 0;
    sub_block_rdcost[6] = 0;
    sub_block_rdcost[7] = 0;
    sub_block_rdcost[0] = 0;
    sub_block_rdcost[1] = 0;
    sub_block_rdcost[2] = 0;
    sub_block_rdcost[3] = 0;
    for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
      lVar3 = part_state->rect_part_rd[0][lVar12];
      if (lVar3 - 1U < 999999999) {
        sub_block_rdcost[lVar12] = (int)lVar3;
      }
    }
    for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
      lVar3 = part_state->rect_part_rd[1][lVar12];
      if (lVar3 - 1U < 999999999) {
        sub_block_rdcost[lVar12 + 2] = (int)lVar3;
      }
    }
    for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
      if (part_state->split_rd[lVar12] - 1U < 999999999) {
        sub_block_rdcost[lVar12 + 4] = (int)part_state->split_rd[lVar12];
      }
    }
    for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 1) {
      iVar10 = sub_block_rdcost[lVar12];
      if (iVar10 < (int)best_rd) {
        fVar20 = (float)iVar10 / (float)(int)best_rd;
      }
      else {
        fVar20 = 1.0;
      }
      if (iVar10 < 1) {
        fVar20 = 1.0;
      }
      features[lVar12 + 2] = fVar20;
    }
    horz_4_source_var[0] = 0;
    horz_4_source_var[1] = 0;
    horz_4_source_var[2] = 0;
    horz_4_source_var[3] = 0;
    vert_4_source_var[0] = 0;
    vert_4_source_var[1] = 0;
    vert_4_source_var[2] = 0;
    vert_4_source_var[3] = 0;
    BVar6 = (BLOCK_SIZE)mi_col;
    BVar8 = get_partition_subsize(BVar6,'\b');
    BVar5 = get_partition_subsize(BVar6,'\t');
    uVar15 = (ulong)mi_col;
    av1_setup_src_planes
              (x,cpi->source,iVar11,iVar16,
               (uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1,BVar6);
    iVar11 = x->plane[0].src.stride;
    puVar4 = x->plane[0].src.buf;
    bVar1 = block_size_high[BVar8];
    bVar2 = block_size_wide[BVar5];
    iVar16 = 0;
    puVar17 = puVar4;
    for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
      score._0_8_ = puVar4 + iVar16;
      int_score._0_8_ = puVar17;
      uVar9 = av1_get_perpixel_variance_facade(cpi,&x->e_mbd,(buf_2d *)score,BVar8,0);
      horz_4_source_var[lVar12] = uVar9;
      uVar9 = av1_get_perpixel_variance_facade(cpi,&x->e_mbd,(buf_2d *)int_score,BVar5,0);
      vert_4_source_var[lVar12] = uVar9;
      iVar16 = iVar16 + (uint)bVar1 * iVar11;
      puVar17 = puVar17 + bVar2;
    }
    for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
      fVar19 = (float)(horz_4_source_var[lVar12] + 1) / (float)(pb_source_variance + 1);
      fVar20 = 0.1;
      if (0.1 <= fVar19) {
        fVar20 = fVar19;
      }
      fVar19 = 10.0;
      if (fVar20 <= 10.0) {
        fVar19 = fVar20;
      }
      features[lVar12 + 10] = fVar19;
    }
    for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
      fVar19 = (float)(vert_4_source_var[lVar12] + 1) / (float)(pb_source_variance + 1);
      fVar20 = 0.1;
      if (0.1 <= fVar19) {
        fVar20 = fVar19;
      }
      fVar19 = 10.0;
      if (fVar20 <= 10.0) {
        fVar19 = fVar20;
      }
      features[lVar12 + 0xe] = fVar19;
    }
    if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
      write_features_to_file
                ((cpi->oxcf).partition_info_path,(cpi->ext_part_controller).test_mode != 0,features,
                 0x12,7,(BLOCK_SIZE)uVar15,in_stack_ffffffffffffd3b8,mi_col);
    }
    score[0] = 0.0;
    score[1] = 0.0;
    score[2] = 0.0;
    score[3] = 0.0;
    (*av1_nn_predict)(features,pNVar14,1,score);
    iVar11 = -1000;
    for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
      iVar16 = (int)(score[lVar12] * 100.0);
      int_score[lVar12] = iVar16;
      if (iVar11 <= iVar16) {
        iVar11 = iVar16;
      }
    }
    if ((mi_col == 6) || (mi_col == 9)) {
      iVar11 = iVar11 + -500;
    }
    else if (mi_col == 0xc) {
      iVar11 = iVar11 + -200;
    }
    part4_allowed[0] = 0;
    part4_allowed[1] = 0;
    for (uVar15 = 0; uVar15 != 4; uVar15 = uVar15 + 1) {
      if (iVar11 <= int_score[uVar15]) {
        if ((uVar15 & 1) != 0) {
          *part4_allowed = 1;
        }
        if (1 < uVar15) {
          part4_allowed[1] = 1;
        }
      }
    }
  }
  return;
}

Assistant:

void av1_ml_prune_4_partition(AV1_COMP *const cpi, MACROBLOCK *const x,
                              int part_ctx, int64_t best_rd,
                              PartitionSearchState *part_state,
                              int *part4_allowed,
                              unsigned int pb_source_variance) {
  const PartitionBlkParams blk_params = part_state->part_blk_params;
  const int mi_row = blk_params.mi_row;
  const int mi_col = blk_params.mi_col;
  const BLOCK_SIZE bsize = blk_params.bsize;

  int64_t(*rect_part_rd)[SUB_PARTITIONS_RECT] = part_state->rect_part_rd;
  int64_t *split_rd = part_state->split_rd;
  if (ext_ml_model_decision_after_part_ab(
          cpi, x, bsize, part_ctx, best_rd, rect_part_rd, split_rd,
          &part4_allowed[HORZ4], &part4_allowed[VERT4], pb_source_variance,
          mi_row, mi_col))
    return;

  if (best_rd >= 1000000000) return;
  int64_t *horz_rd = rect_part_rd[HORZ4];
  int64_t *vert_rd = rect_part_rd[VERT4];
  const NN_CONFIG *nn_config = NULL;
  // 4-way partitions are only allowed for these three square block sizes.
  switch (bsize) {
    case BLOCK_16X16: nn_config = &av1_4_partition_nnconfig_16; break;
    case BLOCK_32X32: nn_config = &av1_4_partition_nnconfig_32; break;
    case BLOCK_64X64: nn_config = &av1_4_partition_nnconfig_64; break;
    default: assert(0 && "Unexpected bsize.");
  }
  if (!nn_config) return;

  // Generate features.
  float features[FEATURES];
  int feature_index = 0;
  features[feature_index++] = (float)part_ctx;
  features[feature_index++] = (float)get_unsigned_bits(pb_source_variance);

  const int rdcost = (int)AOMMIN(INT_MAX, best_rd);
  int sub_block_rdcost[8] = { 0 };
  int rd_index = 0;
  for (int i = 0; i < SUB_PARTITIONS_RECT; ++i) {
    if (horz_rd[i] > 0 && horz_rd[i] < 1000000000)
      sub_block_rdcost[rd_index] = (int)horz_rd[i];
    ++rd_index;
  }
  for (int i = 0; i < SUB_PARTITIONS_RECT; ++i) {
    if (vert_rd[i] > 0 && vert_rd[i] < 1000000000)
      sub_block_rdcost[rd_index] = (int)vert_rd[i];
    ++rd_index;
  }
  for (int i = 0; i < SUB_PARTITIONS_SPLIT; ++i) {
    if (split_rd[i] > 0 && split_rd[i] < 1000000000)
      sub_block_rdcost[rd_index] = (int)split_rd[i];
    ++rd_index;
  }
  for (int i = 0; i < 8; ++i) {
    // Ratio between the sub-block RD and the whole-block RD.
    float rd_ratio = 1.0f;
    if (sub_block_rdcost[i] > 0 && sub_block_rdcost[i] < rdcost)
      rd_ratio = (float)sub_block_rdcost[i] / (float)rdcost;
    features[feature_index++] = rd_ratio;
  }

  // Get variance of the 1:4 and 4:1 sub-blocks.
  unsigned int horz_4_source_var[SUB_PARTITIONS_PART4] = { 0 };
  unsigned int vert_4_source_var[SUB_PARTITIONS_PART4] = { 0 };
  {
    BLOCK_SIZE horz_4_bs = get_partition_subsize(bsize, PARTITION_HORZ_4);
    BLOCK_SIZE vert_4_bs = get_partition_subsize(bsize, PARTITION_VERT_4);

    assert(horz_4_bs != BLOCK_INVALID);
    assert(vert_4_bs != BLOCK_INVALID);

    av1_setup_src_planes(x, cpi->source, mi_row, mi_col,
                         av1_num_planes(&cpi->common), bsize);
    const int src_stride = x->plane[0].src.stride;
    uint8_t *src = x->plane[0].src.buf;
    const MACROBLOCKD *const xd = &x->e_mbd;

    struct buf_2d horz_4_src, vert_4_src;
    horz_4_src.stride = src_stride;
    vert_4_src.stride = src_stride;

    for (int i = 0; i < SUB_PARTITIONS_PART4; ++i) {
      horz_4_src.buf = src + i * block_size_high[horz_4_bs] * src_stride;
      vert_4_src.buf = src + i * block_size_wide[vert_4_bs];

      horz_4_source_var[i] = av1_get_perpixel_variance_facade(
          cpi, xd, &horz_4_src, horz_4_bs, AOM_PLANE_Y);
      vert_4_source_var[i] = av1_get_perpixel_variance_facade(
          cpi, xd, &vert_4_src, vert_4_bs, AOM_PLANE_Y);
    }
  }

  const float denom = (float)(pb_source_variance + 1);
  const float low_b = 0.1f;
  const float high_b = 10.0f;
  for (int i = 0; i < SUB_PARTITIONS_PART4; ++i) {
    // Ratio between the 4:1 sub-block variance and the whole-block variance.
    float var_ratio = (float)(horz_4_source_var[i] + 1) / denom;
    if (var_ratio < low_b) var_ratio = low_b;
    if (var_ratio > high_b) var_ratio = high_b;
    features[feature_index++] = var_ratio;
  }
  for (int i = 0; i < SUB_PARTITIONS_PART4; ++i) {
    // Ratio between the 1:4 sub-block RD and the whole-block RD.
    float var_ratio = (float)(vert_4_source_var[i] + 1) / denom;
    if (var_ratio < low_b) var_ratio = low_b;
    if (var_ratio > high_b) var_ratio = high_b;
    features[feature_index++] = var_ratio;
  }
  assert(feature_index == FEATURES);

  // Write features to file
  if (!frame_is_intra_only(&cpi->common)) {
    write_features_to_file(cpi->oxcf.partition_info_path,
                           cpi->ext_part_controller.test_mode, features,
                           FEATURES, 7, bsize, mi_row, mi_col);
  }

  // Calculate scores using the NN model.
  float score[LABELS] = { 0.0f };
  av1_nn_predict(features, nn_config, 1, score);
  int int_score[LABELS];
  int max_score = -1000;
  for (int i = 0; i < LABELS; ++i) {
    int_score[i] = (int)(100 * score[i]);
    max_score = AOMMAX(int_score[i], max_score);
  }

  // Make decisions based on the model scores.
  int thresh = max_score;
  switch (bsize) {
    case BLOCK_16X16: thresh -= 500; break;
    case BLOCK_32X32: thresh -= 500; break;
    case BLOCK_64X64: thresh -= 200; break;
    default: break;
  }
  av1_zero_array(part4_allowed, NUM_PART4_TYPES);
  for (int i = 0; i < LABELS; ++i) {
    if (int_score[i] >= thresh) {
      if ((i >> 0) & 1) part4_allowed[HORZ4] = 1;
      if ((i >> 1) & 1) part4_allowed[VERT4] = 1;
    }
  }
}